

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setJoinExpr(Expr *p,int iTable)

{
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 local_8;
  
  for (local_8 = in_RDI; local_8 != 0; local_8 = *(long *)(local_8 + 0x18)) {
    *(uint *)(local_8 + 4) = *(uint *)(local_8 + 4) | 1;
    *(short *)(local_8 + 0x34) = (short)in_ESI;
    setJoinExpr((Expr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->iRightJoinTable = (i16)iTable;
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}